

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O3

void bcache_shutdown(void)

{
  int iVar1;
  uint uVar2;
  list_elem *plVar3;
  list_elem *plVar4;
  
  pthread_spin_lock(&freelist_lock);
  plVar3 = freelist.head;
  while (plVar3 != (list_elem *)0x0) {
    plVar4 = plVar3 + -3;
    plVar3 = list_remove(&freelist,plVar3);
    LOCK();
    freelist_count.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         ((long)freelist_count.super___atomic_base<unsigned_long>._M_i + -1);
    UNLOCK();
    free(&plVar4->next);
  }
  pthread_spin_unlock(&freelist_lock);
  iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)&filelist_lock);
  plVar3 = file_zombies.head;
  if (iVar1 != 0) {
    bcache_shutdown_cold_1();
    plVar3 = file_zombies.head;
  }
  while (plVar3 != (list_elem *)0x0) {
    plVar4 = list_remove(&file_zombies,plVar3);
    _fname_free((fnamedic_item *)(plVar3 + -2));
    plVar3 = plVar4;
  }
  free(file_list);
  iVar1 = pthread_rwlock_unlock((pthread_rwlock_t *)&filelist_lock);
  if (iVar1 != 0) {
    bcache_shutdown_cold_2();
  }
  free(buffercache_addr);
  pthread_spin_lock(&bcache_lock);
  hash_free_active(&fnamedic,_bcache_free_fnamedic);
  pthread_spin_unlock(&bcache_lock);
  pthread_spin_destroy(&bcache_lock);
  pthread_spin_destroy(&freelist_lock);
  uVar2 = pthread_rwlock_destroy((pthread_rwlock_t *)&filelist_lock);
  if (uVar2 != 0) {
    fprintf(_stderr,"Error in bcache_shutdown(): RW Lock\'s destruction failed; ErrorCode: %d\n",
            (ulong)uVar2);
    return;
  }
  return;
}

Assistant:

void bcache_shutdown()
{
    struct bcache_item *item;
    struct list_elem *e;

    spin_lock(&freelist_lock);
    e = list_begin(&freelist);
    while(e) {
        item = _get_entry(e, struct bcache_item, list_elem);
        e = list_remove(&freelist, e);
        freelist_count--;
        free(item);
    }
    spin_unlock(&freelist_lock);

    writer_lock(&filelist_lock);
    // Force clean zombies if any
    e = list_begin(&file_zombies);
    while (e) {
        struct fnamedic_item *fname = _get_entry(e, struct fnamedic_item, le);
        e = list_remove(&file_zombies, e);
        _fname_free(fname);
    }
    // Free the file list array
    free(file_list);
    writer_unlock(&filelist_lock);

    // Free entire buffercache memory
    free(buffercache_addr);

    spin_lock(&bcache_lock);
    hash_free_active(&fnamedic, _bcache_free_fnamedic);
    spin_unlock(&bcache_lock);

    spin_destroy(&bcache_lock);
    spin_destroy(&freelist_lock);

    int rv = destroy_rw_lock(&filelist_lock);
    if (rv != 0) {
        fprintf(stderr, "Error in bcache_shutdown(): "
                        "RW Lock's destruction failed; ErrorCode: %d\n", rv);
    }
}